

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sndio.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_238a35::SndioCapture::start(SndioCapture *this)

{
  int iVar1;
  backend_exception *this_00;
  _Mem_fn<int_((anonymous_namespace)::SndioCapture::*)()> *this_01;
  long in_RDI;
  exception *e;
  thread *in_stack_ffffffffffffff88;
  memory_order in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  atomic<bool> *in_stack_ffffffffffffff98;
  code *__args;
  _Mem_fn<int_((anonymous_namespace)::SndioCapture::*)()> *__f;
  
  iVar1 = sio_start(*(undefined8 *)(in_RDI + 0x10));
  if (iVar1 == 0) {
    this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
    al::backend_exception::backend_exception(this_00,0xa001,"Error starting capture");
    __cxa_throw(this_00,&al::backend_exception::typeinfo,al::backend_exception::~backend_exception);
  }
  std::atomic<bool>::store
            (in_stack_ffffffffffffff98,SUB41((uint)in_stack_ffffffffffffff94 >> 0x18,0),
             in_stack_ffffffffffffff90);
  __args = recordProc;
  __f = (_Mem_fn<int_((anonymous_namespace)::SndioCapture::*)()> *)0x0;
  this_01 = std::mem_fn<int(),(anonymous_namespace)::SndioCapture>
                      ((offset_in_SndioCapture_to_subr)in_stack_ffffffffffffff98);
  std::thread::
  thread<std::_Mem_fn<int((anonymous_namespace)::SndioCapture::*)()>,(anonymous_namespace)::SndioCapture*,void>
            ((thread *)this_01,__f,(SndioCapture **)__args);
  std::thread::operator=
            ((thread *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  std::thread::~thread((thread *)0x23e173);
  return;
}

Assistant:

void SndioCapture::start()
{
    if(!sio_start(mSndHandle))
        throw al::backend_exception{ALC_INVALID_DEVICE, "Error starting capture"};

    try {
        mKillNow.store(false, std::memory_order_release);
        mThread = std::thread{std::mem_fn(&SndioCapture::recordProc), this};
    }
    catch(std::exception& e) {
        sio_stop(mSndHandle);
        throw al::backend_exception{ALC_INVALID_DEVICE, "Failed to start mixing thread: %s",
            e.what()};
    }
}